

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O2

char * Io_WriteVerilogGetName(char *pName)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar3 = strlen(pName);
  iVar2 = (int)sVar3;
  if ((iVar2 == 1) && ((*pName & 0xfeU) == 0x30)) {
    uVar5 = 1;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    if (0 < iVar2) {
      uVar5 = sVar3 & 0xffffffff;
    }
    for (; (uVar4 = uVar5, uVar5 != uVar6 &&
           ((bVar1 = pName[uVar6], (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a ||
            (uVar4 = uVar6, bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)))); uVar6 = uVar6 + 1) {
    }
    if ((int)uVar4 == iVar2) {
      return pName;
    }
  }
  Io_WriteVerilogGetName::Buffer[0] = '\\';
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    Io_WriteVerilogGetName::Buffer[uVar6 + 1] = pName[uVar6];
  }
  Io_WriteVerilogGetName::Buffer[(long)((sVar3 << 0x20) + 0x100000000) >> 0x20] = ' ';
  Io_WriteVerilogGetName::Buffer[(long)((sVar3 << 0x20) + 0x200000000) >> 0x20] = '\0';
  return Io_WriteVerilogGetName::Buffer;
}

Assistant:

char * Io_WriteVerilogGetName( char * pName )
{
    static char Buffer[500];
    int Length, i;
    Length = strlen(pName);
    // consider the case of a signal having name "0" or "1"
    if ( !(Length == 1 && (pName[0] == '0' || pName[0] == '1')) )
    {
        for ( i = 0; i < Length; i++ )
            if ( !((pName[i] >= 'a' && pName[i] <= 'z') || 
                 (pName[i] >= 'A' && pName[i] <= 'Z') || 
                 (pName[i] >= '0' && pName[i] <= '9') || pName[i] == '_') )
                 break;
        if ( i == Length )
            return pName;
    }
    // create Verilog style name
    Buffer[0] = '\\';
    for ( i = 0; i < Length; i++ )
        Buffer[i+1] = pName[i];
    Buffer[Length+1] = ' ';
    Buffer[Length+2] = 0;
    return Buffer;
}